

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void http_wr_submit(nni_http_conn *conn,nni_aio *aio,write_flavor flavor)

{
  _Bool _Var1;
  
  nni_aio_reset(aio);
  if (conn->closed == true) {
    nni_aio_finish_error(aio,NNG_ECLOSED);
    return;
  }
  _Var1 = nni_aio_start(aio,http_wr_cancel,conn);
  if (_Var1) {
    conn->wr_flavor = flavor;
    nni_list_append(&conn->wrq,aio);
    if (conn->wr_uaio == (nni_aio *)0x0) {
      http_wr_start(conn);
      return;
    }
  }
  return;
}

Assistant:

static void
http_wr_submit(nni_http_conn *conn, nni_aio *aio, enum write_flavor flavor)
{
	nni_aio_reset(aio);
	if (conn->closed) {
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, http_wr_cancel, conn)) {
		return;
	}
	conn->wr_flavor = flavor;
	nni_list_append(&conn->wrq, aio);

	if (conn->wr_uaio == NULL) {
		http_wr_start(conn);
	}
}